

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O2

bool __thiscall
node::anon_unknown_2::ChainImpl::hasDescendantsInMempool(ChainImpl *this,uint256 *txid)

{
  CTxMemPool *pCVar1;
  CTxMemPoolEntry *pCVar2;
  long in_FS_OFFSET;
  bool bVar3;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock38;
  unique_lock<std::recursive_mutex> uStack_48;
  Txid local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar1 = (this->m_node->mempool)._M_t.
           super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
           super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
           super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl;
  if (pCVar1 == (CTxMemPool *)0x0) {
    bVar3 = false;
  }
  else {
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&uStack_48,&pCVar1->cs,
               "m_node.mempool->cs",
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/interfaces.cpp"
               ,0x2a2,false);
    local_38.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ =
         *(undefined8 *)(txid->super_base_blob<256U>).m_data._M_elems;
    local_38.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
         *(undefined8 *)((txid->super_base_blob<256U>).m_data._M_elems + 8);
    local_38.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
         *(undefined8 *)((txid->super_base_blob<256U>).m_data._M_elems + 0x10);
    local_38.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ =
         *(undefined8 *)((txid->super_base_blob<256U>).m_data._M_elems + 0x18);
    pCVar2 = CTxMemPool::GetEntry
                       ((this->m_node->mempool)._M_t.
                        super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
                        super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                        super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl,&local_38);
    if (pCVar2 == (CTxMemPoolEntry *)0x0) {
      bVar3 = false;
    }
    else {
      bVar3 = 1 < (ulong)pCVar2->m_count_with_descendants;
    }
    std::unique_lock<std::recursive_mutex>::~unique_lock(&uStack_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool hasDescendantsInMempool(const uint256& txid) override
    {
        if (!m_node.mempool) return false;
        LOCK(m_node.mempool->cs);
        const auto entry{m_node.mempool->GetEntry(Txid::FromUint256(txid))};
        if (entry == nullptr) return false;
        return entry->GetCountWithDescendants() > 1;
    }